

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::anon_unknown_37::FailureTest::FailureTest
          (FailureTest *this,CodeLocation *loc,string *error_message,bool as_error)

{
  byte in_CL;
  CodeLocation *in_RDX;
  undefined8 *in_RDI;
  CodeLocation *in_stack_ffffffffffffffb8;
  Test *in_stack_ffffffffffffffd0;
  
  Test::Test(in_stack_ffffffffffffffd0);
  *in_RDI = &PTR__FailureTest_001a93f0;
  CodeLocation::CodeLocation(in_RDX,in_stack_ffffffffffffffb8);
  std::__cxx11::string::string((string *)(in_RDI + 7),(string *)in_RDX);
  *(byte *)(in_RDI + 0xb) = in_CL & 1;
  return;
}

Assistant:

explicit FailureTest(const CodeLocation& loc, std::string error_message,
                       bool as_error)
      : loc_(loc),
        error_message_(std::move(error_message)),
        as_error_(as_error) {}